

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O3

int s2pred::TriageCompareSin2Distances<long_double>
              (Vector3<long_double> *x,Vector3<long_double> *a,Vector3<long_double> *b)

{
  longdouble lVar1;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  int iVar5;
  longdouble in_ST0;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  longdouble lVar9;
  longdouble lVar10;
  longdouble lVar11;
  longdouble lVar12;
  
  lVar7 = *(longdouble *)(a->c_ + 1);
  lVar8 = *(longdouble *)(a->c_ + 2);
  lVar1 = *(longdouble *)(x->c_ + 1);
  lVar2 = *(longdouble *)(x->c_ + 2);
  lVar6 = (lVar7 - lVar1) * (lVar2 + lVar8) - (lVar7 + lVar1) * (lVar8 - lVar2);
  lVar3 = *(longdouble *)a->c_;
  lVar4 = *(longdouble *)x->c_;
  lVar11 = (lVar8 - lVar2) * (lVar3 + lVar4) - (lVar2 + lVar8) * (lVar3 - lVar4);
  lVar9 = (lVar3 - lVar4) * (lVar7 + lVar1) - (lVar7 - lVar1) * (lVar3 + lVar4);
  lVar11 = ((longdouble)0.25 * (lVar9 * lVar9 + lVar11 * lVar11 + lVar6 * lVar6)) /
           ((lVar2 * lVar2 + lVar1 * lVar1 + lVar4 * lVar4) *
           (lVar8 * lVar8 + lVar7 * lVar7 + lVar3 * lVar3));
  lVar6 = in_ST0;
  sqrtl();
  lVar7 = *(longdouble *)(b->c_ + 1);
  lVar8 = *(longdouble *)(b->c_ + 2);
  lVar1 = *(longdouble *)(x->c_ + 1);
  lVar2 = *(longdouble *)(x->c_ + 2);
  lVar9 = (lVar7 - lVar1) * (lVar2 + lVar8) - (lVar7 + lVar1) * (lVar8 - lVar2);
  lVar3 = *(longdouble *)b->c_;
  lVar4 = *(longdouble *)x->c_;
  lVar12 = (lVar8 - lVar2) * (lVar3 + lVar4) - (lVar2 + lVar8) * (lVar3 - lVar4);
  lVar10 = (lVar3 - lVar4) * (lVar7 + lVar1) - (lVar7 - lVar1) * (lVar3 + lVar4);
  lVar7 = ((longdouble)0.25 * (lVar10 * lVar10 + lVar12 * lVar12 + lVar9 * lVar9)) /
          ((lVar2 * lVar2 + lVar1 * lVar1 + lVar4 * lVar4) *
          (lVar8 * lVar8 + lVar7 * lVar7 + lVar3 * lVar3));
  sqrtl();
  lVar8 = (longdouble)1.0803100617998676e-18 * lVar11 + (longdouble)3.3358085154969946e-34 * in_ST0
          + (longdouble)2.781904613015566e-68 +
          (longdouble)2.781904613015566e-68 +
          (longdouble)1.0803100617998676e-18 * lVar7 + (longdouble)3.3358085154969946e-34 * lVar6;
  lVar11 = lVar11 - lVar7;
  iVar5 = 1;
  if (lVar11 <= lVar8) {
    iVar5 = -(uint)(lVar11 < -lVar8);
  }
  return iVar5;
}

Assistant:

int TriageCompareSin2Distances(const Vector3<T>& x,
                               const Vector3<T>& a, const Vector3<T>& b) {
  T sin2_ax_error, sin2_bx_error;
  T sin2_ax = GetSin2Distance(a, x, &sin2_ax_error);
  T sin2_bx = GetSin2Distance(b, x, &sin2_bx_error);
  T diff = sin2_ax - sin2_bx;
  T error = sin2_ax_error + sin2_bx_error;
  return (diff > error) ? 1 : (diff < -error) ? -1 : 0;
}